

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_policy_traits.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     common_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,void>
     ::transfer_impl<std::allocator<google::protobuf::Descriptor_const*>,void>
               (undefined8 param_1,remove_const_t<slot_type>_conflict15 *new_slot,
               remove_const_t<slot_type>_conflict15 *old_slot)

{
  Descriptor **ppDVar1;
  Descriptor **ppDVar2;
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<const_google::protobuf::Descriptor_*> *param_0_local;
  
  ppDVar1 = element<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>>
                      (new_slot);
  ppDVar1 = std::launder<google::protobuf::Descriptor_const*>(ppDVar1);
  ppDVar2 = element<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>>
                      (old_slot);
  *ppDVar1 = *ppDVar2;
  return;
}

Assistant:

static std::true_type transfer_impl(Alloc*, slot_type* new_slot,
                                      slot_type* old_slot, Rank1) {
    // TODO(b/247130232): remove casts after fixing warnings.
    // TODO(b/251814870): remove casts after fixing warnings.
    std::memcpy(
        static_cast<void*>(std::launder(
            const_cast<std::remove_const_t<value_type>*>(&element(new_slot)))),
        static_cast<const void*>(&element(old_slot)), sizeof(value_type));
    return {};
  }